

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

bool __thiscall
andres::View<int,true,std::allocator<unsigned_long>>::
overlaps<int,false,std::allocator<unsigned_long>>
          (View<int,true,std::allocator<unsigned_long>> *this,
          View<int,_false,_std::allocator<unsigned_long>_> *v)

{
  reference piVar1;
  reference piVar2;
  size_t sVar3;
  reference piVar4;
  reference piVar5;
  void *maxPointerV;
  void *maxPointer;
  void *vDataPointer_;
  void *dataPointer_;
  View<int,_false,_std::allocator<unsigned_long>_> *v_local;
  View<int,_true,_std::allocator<unsigned_long>_> *this_local;
  
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  if ((*(long *)this == 0) || (v->data_ == (pointer)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    piVar1 = *(reference *)this;
    piVar2 = v->data_;
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
    piVar4 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)this,sVar3 - 1);
    sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::size(v);
    piVar5 = View<int,_false,_std::allocator<unsigned_long>_>::operator()(v,sVar3 - 1);
    if (((piVar2 < piVar1) || (piVar4 < piVar2)) && ((piVar1 < piVar2 || (piVar5 < piVar1)))) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool View<T, isConst, A>::overlaps
(
    const View<TLocal, isConstLocal, ALocal>& v
) const
{
    testInvariant();
    if(!MARRAY_NO_ARG_TEST) {
        v.testInvariant();
    }
    if(data_ == 0 || v.data_ == 0) {
        return false;
    }
    else {
        const void* dataPointer_ = data_;
        const void* vDataPointer_ = v.data_;
        const void* maxPointer = & (*this)(this->size()-1);
        const void* maxPointerV = & v(v.size()-1);
        if(    (dataPointer_   <= vDataPointer_ && vDataPointer_ <= maxPointer)
            || (vDataPointer_ <= dataPointer_   && dataPointer_   <= maxPointerV) )
        {
            return true;
        }
    }
    return false;
}